

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_regex_traits.hpp
# Opt level: O0

char_class_type
boost::xpressive::cpp_regex_traits<char>::lookup_classname_impl_<char*>(char *begin,char *end)

{
  bool bVar1;
  char_class_pair *pcVar2;
  char *in_RSI;
  char *in_RDI;
  size_t j;
  size_t local_20;
  
  local_20 = 0;
  while( true ) {
    pcVar2 = char_class(local_20);
    if (pcVar2->class_name_ == (char_type *)0x0) {
      return 0;
    }
    pcVar2 = char_class(local_20);
    bVar1 = compare_<char*>(pcVar2->class_name_,in_RDI,in_RSI);
    if (bVar1) break;
    local_20 = local_20 + 1;
  }
  pcVar2 = char_class(local_20);
  return pcVar2->class_type_;
}

Assistant:

static char_class_type lookup_classname_impl_(FwdIter begin, FwdIter end)
    {
        // find the classname
        typedef cpp_regex_traits<Char> this_t;
        for(std::size_t j = 0; 0 != this_t::char_class(j).class_name_; ++j)
        {
            if(this_t::compare_(this_t::char_class(j).class_name_, begin, end))
            {
                return this_t::char_class(j).class_type_;
            }
        }
        return 0;
    }